

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_pHYs(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  int unit_type;
  png_uint_32 res_y;
  png_uint_32 res_x;
  byte local_20;
  byte local_1f;
  byte local_1e;
  png_byte buf [9];
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  buf._1_4_ = length;
  unique0x100001b0 = info_ptr;
  if ((png_ptr->mode & 1) != 0) {
    if ((png_ptr->mode & 4) == 0) {
      if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x80) == 0)) {
        if (length == 9) {
          png_crc_read(png_ptr,(png_bytep)((long)&res_y + 3),9);
          iVar1 = png_crc_finish(png_ptr,0);
          if (iVar1 == 0) {
            png_set_pHYs(png_ptr,stack0xffffffffffffffe8,
                         (uint)res_y._3_1_ * 0x1000000 + (uint)(byte)res_x * 0x10000 +
                         (uint)res_x._1_1_ * 0x100 + (uint)res_x._2_1_,
                         (uint)res_x._3_1_ * 0x1000000 + (uint)local_20 * 0x10000 +
                         (uint)local_1f * 0x100 + (uint)local_1e,(uint)buf[0]);
          }
        }
        else {
          png_crc_finish(png_ptr,length);
          png_chunk_benign_error(png_ptr,"invalid");
        }
      }
      else {
        png_crc_finish(png_ptr,length);
        png_chunk_benign_error(png_ptr,"duplicate");
      }
    }
    else {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"out of place");
    }
    return;
  }
  png_chunk_error(png_ptr,"missing IHDR");
}

Assistant:

void /* PRIVATE */
png_handle_pHYs(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte buf[9];
   png_uint_32 res_x, res_y;
   int unit_type;

   png_debug(1, "in png_handle_pHYs");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_pHYs) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if (length != 9)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, buf, 9);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   res_x = png_get_uint_32(buf);
   res_y = png_get_uint_32(buf + 4);
   unit_type = buf[8];
   png_set_pHYs(png_ptr, info_ptr, res_x, res_y, unit_type);
}